

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O2

void nsync_cv_broadcast(nsync_cv *pcv)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  nsync_dll_element_ *e;
  nsync_dll_element_ *pnVar4;
  nsync_dll_list_ pnVar5;
  nsync_dll_list_ list;
  uint all_readers;
  bool bVar6;
  
  if ((pcv->word & 2) != 0) {
    all_readers = 1;
    list = (nsync_dll_list_)0x0;
    nsync_spin_test_and_set_(&pcv->word,1,1,0);
    e = nsync_dll_first_(pcv->waiters);
    while (e != (nsync_dll_element_ *)0x0) {
      pvVar2 = e->container;
      pnVar4 = nsync_dll_next_(pcv->waiters,e);
      bVar6 = all_readers != 0;
      all_readers = 0;
      if ((bVar6) && ((*(byte *)((long)pvVar2 + 0x30) & 1) != 0)) {
        all_readers = (uint)(*(lock_type **)((long)e->container + 0x40) == nsync_reader_type_);
      }
      pnVar5 = nsync_dll_remove_(pcv->waiters,e);
      pcv->waiters = pnVar5;
      if ((*(byte *)((long)pvVar2 + 0x30) & 1) != 0) {
        do {
          iVar3 = *(int *)((long)e->container + 0x48);
          piVar1 = (int *)((long)e->container + 0x48);
          LOCK();
          bVar6 = iVar3 == *piVar1;
          if (bVar6) {
            *piVar1 = iVar3 + 1;
          }
          UNLOCK();
        } while (!bVar6);
      }
      list = nsync_dll_make_last_in_list_(list,e);
      e = pnVar4;
    }
    pcv->word = 0;
    iVar3 = nsync_dll_is_empty_(list);
    if (iVar3 == 0) {
      wake_waiters(list,all_readers);
      return;
    }
  }
  return;
}

Assistant:

void nsync_cv_broadcast (nsync_cv *pcv) {
	IGNORE_RACES_START ();
	if ((ATM_LOAD_ACQ (&pcv->word) & CV_NON_EMPTY) != 0) { /* acquire load */
		nsync_dll_element_ *p;
		nsync_dll_element_ *next;
		int all_readers;
		nsync_dll_list_ to_wake_list = NULL;   /* waiters that we will wake */
		/* acquire spinlock */
		nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
		p = NULL;
		next = NULL;
		all_readers = 1;
		/* Wake entire waiter list, which we leave empty. */
		for (p = nsync_dll_first_ (pcv->waiters); p != NULL; p = next) {
			struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
			next = nsync_dll_next_ (pcv->waiters, p);
			all_readers = all_readers && (p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
				      (DLL_WAITER (p)->l_type == nsync_reader_type_);
			pcv->waiters = nsync_dll_remove_ (pcv->waiters, p);
			if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
				uint32_t old_value;
				do {    
					old_value = ATM_LOAD (&DLL_WAITER (p)->remove_count);
				} while (!ATM_CAS (&DLL_WAITER (p)->remove_count,
						   old_value, old_value+1));
			}
			to_wake_list = nsync_dll_make_last_in_list_ (to_wake_list, p);
		}
		/* Release spinlock and mark queue empty. */
		ATM_STORE_REL (&pcv->word, 0); /* release store */
		if (!nsync_dll_is_empty_ (to_wake_list)) {    /* Wake them. */
			wake_waiters (to_wake_list, all_readers);
		}
	}
	IGNORE_RACES_END ();
}